

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void pobr::utils::Logger::print(uint *labelShift,string *message)

{
  ostream *poVar1;
  istream *piVar2;
  string line;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream messageStream;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&messageStream);
  std::operator<<(local_1a8,(string *)message);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&messageStream,(string *)&line);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&line);
  std::endl<char,std::char_traits<char>>(poVar1);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&messageStream,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    local_1d8[0] = local_1c8;
    std::__cxx11::string::_M_construct((ulong)local_1d8,(char)*labelShift);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_1d8);
    poVar1 = std::operator<<(poVar1,(string *)&line);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::stringstream::~stringstream((stringstream *)&messageStream);
  return;
}

Assistant:

void Logger::print(const unsigned int& labelShift, const std::string& message)
{
    std::stringstream messageStream;
    messageStream << message;

    std::string line;

    std::getline(messageStream, line);
    std::cout << line << std::endl;

    while (std::getline(messageStream, line))
    {
        std::cout << std::string(labelShift, ' ') << line << std::endl;
    }
}